

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

void __thiscall DPlayerMenu::Drawer(DPlayerMenu *this)

{
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  int iVar3;
  char *string;
  
  DListMenu::Drawer(&this->super_DListMenu);
  pDVar2 = screen;
  pFVar1 = SmallFont;
  iVar3 = FFont::StringWidth(SmallFont,(BYTE *)"PRESS \x1cJSPACE");
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,5,0x100 - iVar3 / 2,0xa8,"PRESS \x1cJSPACE",0x40001390,
                    1,0);
  pDVar2 = screen;
  pFVar1 = SmallFont;
  string = "TO SEE FRONT";
  if (this->mRotation == 0) {
    string = "TO SEE BACK";
  }
  iVar3 = FFont::StringWidth(SmallFont,(BYTE *)string);
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,5,0x100 - iVar3 / 2,SmallFont->FontHeight + 0xa8,string
                    ,0x40001390,1,0);
  return;
}

Assistant:

void DPlayerMenu::Drawer ()
{

	Super::Drawer();

	const char *str = "PRESS " TEXTCOLOR_WHITE "SPACE";
	screen->DrawText (SmallFont, CR_GOLD, 320 - 32 - 32 -
		SmallFont->StringWidth (str)/2,
		50 + 48 + 70, str,
		DTA_Clean, true, TAG_DONE);
	str = mRotation ? "TO SEE FRONT" : "TO SEE BACK";
	screen->DrawText (SmallFont, CR_GOLD, 320 - 32 - 32 -
		SmallFont->StringWidth (str)/2,
		50 + 48 + 70 + SmallFont->GetHeight (), str,
		DTA_Clean, true, TAG_DONE);

}